

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

void CloseWindow(void)

{
  MsfGifResult result;
  
  if (gifRecording == '\x01') {
    msf_gif_end(&result,&gifState);
    free(result.data);
    gifRecording = '\0';
  }
  UnloadFontDefault();
  rlglClose();
  ClosePlatform();
  CORE.Window.ready = false;
  TraceLog(3,"Window closed successfully");
  return;
}

Assistant:

void CloseWindow(void)
{
#if defined(SUPPORT_GIF_RECORDING)
    if (gifRecording)
    {
        MsfGifResult result = msf_gif_end(&gifState);
        msf_gif_free(result);
        gifRecording = false;
    }
#endif

#if defined(SUPPORT_MODULE_RTEXT) && defined(SUPPORT_DEFAULT_FONT)
    UnloadFontDefault();        // WARNING: Module required: rtext
#endif

    rlglClose();                // De-init rlgl

    // De-initialize platform
    //--------------------------------------------------------------
    ClosePlatform();
    //--------------------------------------------------------------

    CORE.Window.ready = false;
    TRACELOG(LOG_INFO, "Window closed successfully");
}